

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O1

void __thiscall FFT_MultipliesBothEmpty_Test::TestBody(FFT_MultipliesBothEmpty_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<long_long> __l;
  vector<long_long,_std::allocator<long_long>_> local_a8;
  vector<long_long,_std::allocator<long_long>_> local_88;
  undefined1 local_70 [8];
  vector<long_long,_std::allocator<long_long>_> res;
  AssertionResult gtest_ar;
  vector<long_long,_std::allocator<long_long>_> local_30;
  allocator_type local_11;
  
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_88.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)local_70,&local_a8,&local_88)
  ;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar.message_;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_30,__l,&local_11);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"(vector<ll> {0, 0})","res",&local_30,
             (vector<long_long,_std::allocator<long_long>_> *)local_70);
  if (local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((char)res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start + 8))();
      }
      local_30.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  if (local_88.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(FFT, MultipliesBothEmpty) {
    vector<ll> p1 = {};
    vector<ll> p2 = {};
    vector<ll> res = multiplyPolynomials(p1, p2);
    EXPECT_EQ((vector<ll> {0, 0}), res);
}